

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O0

Read<signed_char> __thiscall Omega_h::Future<signed_char>::get(Future<signed_char> *this)

{
  void *extraout_RDX;
  long in_RSI;
  Read<signed_char> RVar1;
  Write<signed_char> local_28;
  Future<signed_char> *this_local;
  
  this_local = this;
  if (*(int *)(in_RSI + 0x58) == 1) {
    *(undefined4 *)(in_RSI + 0x58) = 2;
    Write<signed_char>::Write(&local_28,(Write<signed_char> *)(in_RSI + 0x10));
    std::function<Omega_h::Read<signed_char>_(Omega_h::Write<signed_char>)>::operator()
              ((function<Omega_h::Read<signed_char>_(Omega_h::Write<signed_char>)> *)this,
               (Write<signed_char> *)(in_RSI + 0x20));
    Write<signed_char>::~Write(&local_28);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar1.write_.shared_alloc_;
  }
  fail("Can not ask the result more than once.");
}

Assistant:

Read<T> Future<T>::get() {
  if (status_ == Status::completed) {
    status_ = Status::consumed;
    return callback_(recvbuf_);
#ifdef OMEGA_H_USE_MPI
  } else if (status_ == Status::waiting) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Waitall(static_cast<int>(requests_.size()),
                                     requests_.data(), MPI_STATUS_IGNORE));
    status_ = Status::consumed;
    return callback_(recvbuf_);
#endif  // !OMEGA_H_USE_MPI
  } else {
    fail("Can not ask the result more than once.");
  }
}